

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFanout.c
# Opt level: O0

void Fraig_NodeTransferFanout(Fraig_Node_t *pNodeFrom,Fraig_Node_t *pNodeTo)

{
  Fraig_Node_t *local_30;
  Fraig_Node_t *local_28;
  Fraig_Node_t *local_20;
  Fraig_Node_t *pFanout;
  Fraig_Node_t *pNodeTo_local;
  Fraig_Node_t *pNodeFrom_local;
  
  if (pNodeTo->pFanPivot != (Fraig_Node_t *)0x0) {
    __assert_fail("pNodeTo->pFanPivot == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigFanout.c"
                  ,0x85,"void Fraig_NodeTransferFanout(Fraig_Node_t *, Fraig_Node_t *)");
  }
  if (pNodeTo->pFanFanin1 != (Fraig_Node_t *)0x0) {
    __assert_fail("pNodeTo->pFanFanin1 == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigFanout.c"
                  ,0x86,"void Fraig_NodeTransferFanout(Fraig_Node_t *, Fraig_Node_t *)");
  }
  if (pNodeTo->pFanFanin2 != (Fraig_Node_t *)0x0) {
    __assert_fail("pNodeTo->pFanFanin2 == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigFanout.c"
                  ,0x87,"void Fraig_NodeTransferFanout(Fraig_Node_t *, Fraig_Node_t *)");
  }
  local_20 = pNodeFrom->pFanPivot;
  while (local_20 != (Fraig_Node_t *)0x0) {
    if ((Fraig_Node_t *)((ulong)local_20->p1 & 0xfffffffffffffffe) == pNodeFrom) {
      local_20->p1 = (Fraig_Node_t *)((ulong)pNodeTo ^ (long)(int)((uint)local_20->p1 & 1));
    }
    else if ((Fraig_Node_t *)((ulong)local_20->p2 & 0xfffffffffffffffe) == pNodeFrom) {
      local_20->p2 = (Fraig_Node_t *)((ulong)pNodeTo ^ (long)(int)((uint)local_20->p2 & 1));
    }
    if (local_20 == (Fraig_Node_t *)0x0) {
      local_28 = (Fraig_Node_t *)0x0;
    }
    else {
      if ((Fraig_Node_t *)((ulong)local_20->p1 & 0xfffffffffffffffe) == pNodeFrom) {
        local_30 = local_20->pFanFanin1;
      }
      else {
        local_30 = local_20->pFanFanin2;
      }
      local_28 = local_30;
    }
    local_20 = local_28;
  }
  pNodeTo->pFanPivot = pNodeFrom->pFanPivot;
  pNodeTo->pFanFanin1 = pNodeFrom->pFanFanin1;
  pNodeTo->pFanFanin2 = pNodeFrom->pFanFanin2;
  pNodeFrom->pFanPivot = (Fraig_Node_t *)0x0;
  pNodeFrom->pFanFanin1 = (Fraig_Node_t *)0x0;
  pNodeFrom->pFanFanin2 = (Fraig_Node_t *)0x0;
  return;
}

Assistant:

void Fraig_NodeTransferFanout( Fraig_Node_t * pNodeFrom, Fraig_Node_t * pNodeTo )
{
    Fraig_Node_t * pFanout;
    assert( pNodeTo->pFanPivot == NULL );
    assert( pNodeTo->pFanFanin1 == NULL );
    assert( pNodeTo->pFanFanin2 == NULL );
    // go through the fanouts and update their fanins
    Fraig_NodeForEachFanout( pNodeFrom, pFanout )
    {
        if ( Fraig_Regular(pFanout->p1) == pNodeFrom )
            pFanout->p1 = Fraig_NotCond( pNodeTo, Fraig_IsComplement(pFanout->p1) );
        else if ( Fraig_Regular(pFanout->p2) == pNodeFrom )
            pFanout->p2 = Fraig_NotCond( pNodeTo, Fraig_IsComplement(pFanout->p2) );            
    }
    // move the pointers
    pNodeTo->pFanPivot  = pNodeFrom->pFanPivot;  
    pNodeTo->pFanFanin1 = pNodeFrom->pFanFanin1; 
    pNodeTo->pFanFanin2 = pNodeFrom->pFanFanin2;
    pNodeFrom->pFanPivot  = NULL; 
    pNodeFrom->pFanFanin1 = NULL; 
    pNodeFrom->pFanFanin2 = NULL;  
}